

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  TidyParserMemory data;
  Bool BVar3;
  int iVar4;
  Node *node;
  Dict *pDVar5;
  uint uVar6;
  Dict *pDVar7;
  TidyTagId id;
  uint vers;
  Node *pNVar8;
  bool bVar9;
  int local_68;
  uint local_64;
  TidyParserMemory memory;
  
  pLVar2 = doc->lexer;
  if (body == (Node *)0x0) {
    prvTidypopMemory(doc);
    local_68 = memory.register_1;
    local_64 = memory.register_2;
    body = memory.original_node;
  }
  else {
    prvTidyBumpObject(doc,body->parent);
    memory.mode = IgnoreWhitespace;
    local_68 = 1;
    local_64 = 0;
  }
LAB_00139f83:
  do {
    do {
      while( true ) {
        node = prvTidyGetToken(doc,memory.mode);
        if (node == (Node *)0x0) {
          return (Node *)0x0;
        }
        pDVar5 = node->tag;
        pDVar7 = body->tag;
        if ((pDVar5 == pDVar7) && (node->type == StartTag)) goto LAB_00139fcf;
        if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_HTML)) {
          BVar3 = prvTidynodeIsElement(node);
          if ((BVar3 != no) || (pLVar2->seenEndHtml != no)) goto LAB_00139fcf;
          pLVar2->seenEndHtml = yes;
          goto LAB_00139fe4;
        }
        if ((pLVar2->seenEndBody != no) && (node->type - StartTag < 3)) {
          prvTidyReport(doc,body,node,0x233);
          pDVar5 = node->tag;
          pDVar7 = body->tag;
        }
        if ((pDVar5 != pDVar7) || (node->type != EndTag)) break;
        body->closed = yes;
        TrimSpaces(doc,body);
        prvTidyFreeNode(doc,node);
        pLVar2->seenEndBody = yes;
        memory.mode = IgnoreWhitespace;
        if (((body->parent != (Node *)0x0) && (pDVar5 = body->parent->tag, pDVar5 != (Dict *)0x0))
           && (memory.mode = IgnoreWhitespace, pDVar5->id == TidyTag_NOFRAMES)) {
          return (Node *)0x0;
        }
      }
      if (pDVar5 != (Dict *)0x0) {
        if (pDVar5->id - TidyTag_FRAME < 2) {
LAB_0013a08b:
          if (((body->parent != (Node *)0x0) && (pDVar5 = body->parent->tag, pDVar5 != (Dict *)0x0))
             && (pDVar5->id == TidyTag_NOFRAMES)) {
            TrimSpaces(doc,body);
            goto LAB_0013a42d;
          }
        }
        else if (pDVar5->id == TidyTag_NOFRAMES) {
          if (node->type == EndTag) goto LAB_0013a08b;
          if (node->type == StartTag) {
            prvTidyInsertNodeAtEnd(body,node);
            memory.register_1 = local_68;
            goto LAB_0013a504;
          }
        }
      }
      BVar3 = prvTidynodeIsText(node);
      if (BVar3 == no) {
        bVar9 = false;
        local_64 = 0;
      }
      else {
        bVar9 = false;
        local_64 = 0;
        if (node->end <= node->start + 1) {
          bVar9 = pLVar2->lexbuf[node->start] == ' ';
          local_64 = (uint)bVar9;
        }
      }
      pNVar8 = node;
      BVar3 = InsertMisc(body,node);
      id = (TidyTagId)pNVar8;
    } while (BVar3 != no);
    BVar3 = prvTidynodeIsText(node);
    if (BVar3 != no) {
      if ((bool)(bVar9 ^ 1) || memory.mode != IgnoreWhitespace) {
        prvTidyConstrainVersion(doc,0xfffffeda);
        if (local_68 != 0) {
          iVar4 = prvTidyInlineDup(doc,node);
          local_68 = 0;
          if (0 < iVar4) goto LAB_00139f83;
        }
        prvTidyInsertNodeAtEnd(body,node);
        local_68 = 0;
        memory.mode = MixedContent;
        goto LAB_00139f83;
      }
      prvTidyFreeNode(doc,node);
      memory.mode = IgnoreWhitespace;
      local_64 = 1;
      goto LAB_00139f83;
    }
    if (node->type == DocTypeTag) {
      InsertDocType(doc,body,node);
    }
    else {
      if ((node->tag == (Dict *)0x0) || (TVar1 = node->tag->id, TVar1 == TidyTag_PARAM))
      goto LAB_00139fcf;
      pLVar2->excludeBlocks = no;
      if (TVar1 == TidyTag_INPUT) {
LAB_0013a1ba:
        BVar3 = prvTidyIsHTML5Mode(doc);
        if (BVar3 != no) goto LAB_0013a207;
        pDVar5 = node->tag;
LAB_0013a21d:
        uVar6 = pDVar5->model;
        if ((uVar6 & 4) == 0) {
          pNVar8 = body;
          prvTidyReport(doc,body,node,0x27e);
          id = (TidyTagId)pNVar8;
          pDVar5 = node->tag;
          uVar6 = pDVar5->model;
        }
        if ((uVar6 & 2) == 0) {
          if ((uVar6 & 4) == 0) {
            if ((uVar6 & 0x20) == 0) {
              if ((uVar6 & 0x40) == 0) {
                if ((uVar6 & 0x380) == 0) {
                  if (pDVar5->id != TidyTag_INPUT) {
                    BVar3 = prvTidynodeHasCM(node,0x600);
                    if (BVar3 == no) {
LAB_0013a42d:
                      prvTidyUngetToken(doc);
                      return (Node *)0x0;
                    }
                    goto LAB_00139fe4;
                  }
                  prvTidyUngetToken(doc);
                  id = TidyTag_FORM;
                }
                else {
                  if (node->type == EndTag) goto LAB_0013a2fa;
                  prvTidyUngetToken(doc);
                  id = TidyTag_TABLE;
                }
              }
              else {
                prvTidyUngetToken(doc);
                id = TidyTag_DL;
              }
              node = prvTidyInferredTag(doc,id);
            }
            else {
              prvTidyUngetToken(doc);
              node = prvTidyInferredTag(doc,TidyTag_UL);
              pNVar8 = node;
              AddClassNoIndent(doc,node);
              id = (TidyTagId)pNVar8;
            }
LAB_0013a2fa:
            pLVar2->excludeBlocks = yes;
            goto LAB_0013a303;
          }
          MoveToHead(doc,body,node);
        }
        else {
          if (((pDVar5->id == TidyTag_BODY) && (body->implicit != no)) &&
             (body->attributes == (AttVal *)0x0)) {
            body->attributes = node->attributes;
            node->attributes = (AttVal *)0x0;
          }
LAB_00139fe4:
          prvTidyFreeNode(doc,node);
        }
      }
      else {
        id = TidyTag_B;
        BVar3 = prvTidynodeHasCM(node,8);
        if (BVar3 == no) {
          id = TidyTag_BODY;
          BVar3 = prvTidynodeHasCM(node,0x10);
          if (BVar3 == no) goto LAB_0013a1ba;
        }
LAB_0013a207:
        pDVar5 = node->tag;
        if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_LI)) goto LAB_0013a21d;
LAB_0013a303:
        if (node->type == EndTag) {
          if (node->tag == (Dict *)0x0) {
LAB_0013a327:
            id = TidyTag_BODY;
            BVar3 = prvTidynodeHasCM(node,0x10);
            if (BVar3 != no) {
              pNVar8 = node;
              prvTidyPopInline(doc,node);
              id = (TidyTagId)pNVar8;
            }
          }
          else {
            TVar1 = node->tag->id;
            if (TVar1 == TidyTag_P) {
              node->type = StartEndTag;
              node->implicit = yes;
            }
            else {
              if (TVar1 != TidyTag_BR) goto LAB_0013a327;
              node->type = StartTag;
            }
          }
        }
        BVar3 = prvTidynodeIsElement(node);
        if (BVar3 == no) {
LAB_00139fcf:
          prvTidyReport(doc,body,node,0x235);
          goto LAB_00139fe4;
        }
        if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_MAIN)) &&
           (BVar3 = findNodeWithId((doc->root).content,id), BVar3 != no)) {
          *(byte *)&doc->badForm = (byte)doc->badForm | 2;
          goto LAB_00139fcf;
        }
        BVar3 = prvTidynodeHasCM(node,0x10);
        if (BVar3 == no) {
          memory.mode = IgnoreWhitespace;
          local_68 = 1;
          goto LAB_0013a4a8;
        }
        if ((node->tag == (Dict *)0x0) || (vers = 0xfffffedb, node->tag->id != TidyTag_IMG)) {
          vers = 0xfffffeda;
        }
        prvTidyConstrainVersion(doc,vers);
        if (local_68 == 0) goto LAB_0013a48f;
        if (node->implicit != no) {
          memory.mode = MixedContent;
          goto LAB_0013a4a8;
        }
        iVar4 = prvTidyInlineDup(doc,node);
        local_68 = 0;
        if (iVar4 < 1) {
LAB_0013a48f:
          memory.mode = MixedContent;
          local_68 = 0;
LAB_0013a4a8:
          if (node->implicit != no) {
            prvTidyReport(doc,body,node,0x247);
          }
          prvTidyInsertNodeAtEnd(body,node);
          memory.register_1 = local_68;
LAB_0013a504:
          data.original_node = body;
          data.identity = prvTidyParseBody;
          data.reentry_node = node;
          data.reentry_mode = IgnoreWhitespace;
          data.reentry_state = 0;
          data.mode = memory.mode;
          data.register_1 = memory.register_1;
          data.register_2 = local_64;
          data._44_4_ = 0;
          prvTidypushMemory(doc,data);
          return node;
        }
      }
    }
  } while( true );
}

Assistant:

Node* TY_(ParseBody)( TidyDocImpl* doc, Node *body, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool checkstack = no;
    Bool iswhitenode = no;
    DEBUG_LOG_COUNTERS;

    mode = IgnoreWhitespace;
    checkstack = yes;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( body == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        body = memory.original_node;
        checkstack = memory.register_1;
        iswhitenode = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(body);
        TY_(BumpObject)( doc, body->parent );
    }
    
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml)
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody &&
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            DEBUG_LOG_GET_OLD_MODE;
            mode = IgnoreWhitespace;
            DEBUG_LOG_CHANGE_MODE;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TidyParserMemory memory = {0};

                TY_(InsertNodeAtEnd)(body, node);
                
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }

        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            DEBUG_LOG_GET_OLD_MODE;
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;

        if ((( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc)) || nodeIsLI(node) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
            {
                node->type = StartTag;
            }
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node))
            {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( findNodeById(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
                
                DEBUG_LOG_GET_OLD_MODE;
                mode = MixedContent;
                DEBUG_LOG_CHANGE_MODE;
            }
            else
            {
                checkstack = yes;
                DEBUG_LOG_GET_OLD_MODE;
                mode = IgnoreWhitespace;
                DEBUG_LOG_CHANGE_MODE;
            }

            if (node->implicit)
            {
                TY_(Report)(doc, body, node, INSERTING_TAG);
            }

            TY_(InsertNodeAtEnd)(body, node);
            
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
            }
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}